

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeSetSensMaxNonlinIters(void *cvode_mem,int maxcorS)

{
  undefined4 in_ESI;
  long in_RDI;
  bool bVar1;
  int sensi_stg;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x450,"CVodeSetSensMaxNonlinIters",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    bVar1 = false;
    if (*(int *)(in_RDI + 0x8c) != 0) {
      bVar1 = *(int *)(in_RDI + 0x94) == 2;
    }
    if (bVar1) {
      if (*(long *)(in_RDI + 0x748) == 0) {
        cvProcessError((CVodeMem)0x0,-0x14,0x45e,"CVodeSetSensMaxNonlinIters",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                       ,"A memory request failed.");
        local_4 = -0x14;
      }
      else {
        local_4 = SUNNonlinSolSetMaxIters(*(undefined8 *)(in_RDI + 0x748),in_ESI);
      }
    }
    else if (*(long *)(in_RDI + 0x758) == 0) {
      cvProcessError((CVodeMem)0x0,-0x14,0x46a,"CVodeSetSensMaxNonlinIters",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                     ,"A memory request failed.");
      local_4 = -0x14;
    }
    else {
      local_4 = SUNNonlinSolSetMaxIters(*(undefined8 *)(in_RDI + 0x758),in_ESI);
    }
  }
  return local_4;
}

Assistant:

int CVodeSetSensMaxNonlinIters(void* cvode_mem, int maxcorS)
{
  CVodeMem cv_mem;
  sunbooleantype sensi_stg;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  /* Are we computing sensitivities with a staggered approach? */
  sensi_stg = (cv_mem->cv_sensi && (cv_mem->cv_ism == CV_STAGGERED));

  if (sensi_stg)
  {
    /* check that the NLS is non-NULL */
    if (cv_mem->NLSstg == NULL)
    {
      cvProcessError(NULL, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    return (SUNNonlinSolSetMaxIters(cv_mem->NLSstg, maxcorS));
  }
  else
  {
    /* check that the NLS is non-NULL */
    if (cv_mem->NLSstg1 == NULL)
    {
      cvProcessError(NULL, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    return (SUNNonlinSolSetMaxIters(cv_mem->NLSstg1, maxcorS));
  }

  return (CV_SUCCESS);
}